

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<4,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  Geometry *pGVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 (*pauVar18) [16];
  undefined1 (*pauVar19) [16];
  long lVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  vint4 bi;
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [16];
  vint4 ai_1;
  undefined1 auVar69 [16];
  undefined4 uVar70;
  float fVar71;
  float fVar73;
  float fVar74;
  vint4 ai;
  undefined1 auVar72 [16];
  float fVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  uint uVar84;
  uint uVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  uint local_12bc;
  int local_1294;
  long local_1290;
  long local_1288;
  ulong local_1280;
  ulong local_1278;
  RayHit *local_1270;
  RTCIntersectArguments *local_1268;
  RayQueryContext *local_1260;
  Scene *local_1258;
  RTCFilterFunctionNArguments local_1250;
  float local_1220;
  undefined4 local_121c;
  undefined4 local_1218;
  undefined4 local_1214;
  undefined4 local_1210;
  undefined4 local_120c;
  uint local_1208;
  uint local_1204;
  uint local_1200;
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  byte local_109f;
  float local_1080 [4];
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  undefined4 uStack_1064;
  float local_1060 [4];
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  undefined4 uStack_1044;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    local_1260 = context;
    pauVar19 = (undefined1 (*) [16])local_f90;
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    uStack_f98 = 0;
    auVar35 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar34 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar31._8_4_ = 0x7fffffff;
    auVar31._0_8_ = 0x7fffffff7fffffff;
    auVar31._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl((undefined1  [16])aVar1,auVar31);
    auVar77._8_4_ = 0x219392ef;
    auVar77._0_8_ = 0x219392ef219392ef;
    auVar77._12_4_ = 0x219392ef;
    uVar27 = vcmpps_avx512vl(auVar31,auVar77,1);
    bVar3 = (bool)((byte)uVar27 & 1);
    auVar33._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar1.x;
    bVar3 = (bool)((byte)(uVar27 >> 1) & 1);
    auVar33._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar1.y;
    bVar3 = (bool)((byte)(uVar27 >> 2) & 1);
    auVar33._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar1.z;
    bVar3 = (bool)((byte)(uVar27 >> 3) & 1);
    auVar33._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * aVar1.field_3.a;
    auVar31 = vrcp14ps_avx512vl(auVar33);
    auVar32._8_4_ = 0x3f800000;
    auVar32._0_8_ = 0x3f8000003f800000;
    auVar32._12_4_ = 0x3f800000;
    auVar32 = vfnmadd213ps_avx512vl(auVar33,auVar31,auVar32);
    auVar68 = vfmadd132ps_fma(auVar32,auVar31,auVar31);
    auVar31 = vbroadcastss_avx512vl(auVar68);
    auVar92 = ZEXT1664(auVar31);
    auVar31 = vmovshdup_avx(auVar68);
    auVar32 = vshufps_avx512vl(auVar68,auVar68,0x55);
    auVar93 = ZEXT1664(auVar32);
    auVar32 = vshufpd_avx(auVar68,auVar68,1);
    auVar33 = vshufps_avx512vl(auVar68,auVar68,0xaa);
    auVar94 = ZEXT1664(auVar33);
    auVar64._0_4_ = auVar68._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar64._4_4_ = auVar68._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar64._8_4_ = auVar68._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar64._12_4_ = auVar68._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    auVar78._4_4_ = auVar64._0_4_;
    auVar78._0_4_ = auVar64._0_4_;
    auVar78._8_4_ = auVar64._0_4_;
    auVar78._12_4_ = auVar64._0_4_;
    auVar33 = vshufps_avx(auVar64,auVar64,0x55);
    auVar64 = vshufps_avx(auVar64,auVar64,0xaa);
    local_1278 = (ulong)(auVar68._0_4_ < 0.0) << 4;
    local_1280 = (ulong)(auVar31._0_4_ < 0.0) << 4 | 0x20;
    uVar27 = (ulong)(auVar32._0_4_ < 0.0) << 4 | 0x40;
    uVar28 = local_1278 ^ 0x10;
    uVar29 = local_1280 ^ 0x10;
    uVar70 = auVar34._0_4_;
    auVar67 = ZEXT1664(CONCAT412(uVar70,CONCAT48(uVar70,CONCAT44(uVar70,uVar70))));
    auVar68._8_4_ = 0x80000000;
    auVar68._0_8_ = 0x8000000080000000;
    auVar68._12_4_ = 0x80000000;
    auVar34 = vxorps_avx512vl(auVar78,auVar68);
    auVar95 = ZEXT1664(auVar34);
    auVar34 = vxorps_avx512vl(auVar33,auVar68);
    auVar96 = ZEXT1664(auVar34);
    auVar34 = vxorps_avx512vl(auVar64,auVar68);
    auVar97 = ZEXT1664(auVar34);
    auVar35 = vbroadcastss_avx512vl(auVar35);
    auVar98 = ZEXT1664(auVar35);
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar99 = ZEXT3264(auVar49);
    auVar49 = vbroadcastsd_avx512vl(ZEXT816(0x8000000080000000));
    auVar100 = ZEXT3264(auVar49);
    auVar35 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar101 = ZEXT1664(auVar35);
    auVar102 = ZEXT3264(_DAT_01fef940);
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar103 = ZEXT3264(auVar49);
    local_1270 = ray;
LAB_01ea9adc:
    do {
      pauVar18 = pauVar19 + -1;
      pauVar19 = pauVar19 + -1;
      if (*(float *)((long)*pauVar18 + 8) <= (local_1270->super_RayK<1>).tfar) {
        uVar25 = *(ulong *)*pauVar19;
        while ((uVar25 & 8) == 0) {
          auVar35 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(uVar25 + 0x20 + local_1278),auVar95._0_16_,
                               auVar92._0_16_);
          auVar34 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(uVar25 + 0x20 + local_1280),auVar96._0_16_,
                               auVar93._0_16_);
          auVar35 = vpmaxsd_avx(auVar35,auVar34);
          auVar34 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(uVar25 + 0x20 + uVar27),auVar97._0_16_,
                               auVar94._0_16_);
          auVar34 = vpmaxsd_avx512vl(auVar34,auVar98._0_16_);
          auVar35 = vpmaxsd_avx(auVar35,auVar34);
          auVar34 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(uVar25 + 0x20 + uVar28),auVar95._0_16_,
                               auVar92._0_16_);
          auVar31 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(uVar25 + 0x20 + uVar29),auVar96._0_16_,
                               auVar93._0_16_);
          auVar34 = vpminsd_avx(auVar34,auVar31);
          auVar31 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(uVar25 + 0x20 + (uVar27 ^ 0x10)),
                               auVar97._0_16_,auVar94._0_16_);
          auVar31 = vpminsd_avx(auVar31,auVar67._0_16_);
          auVar34 = vpminsd_avx(auVar34,auVar31);
          uVar30 = vpcmpd_avx512vl(auVar35,auVar34,2);
          uVar30 = uVar30 & 0xf;
          local_1120._0_16_ = auVar35;
          if ((char)uVar30 == '\0') {
            if (pauVar19 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            goto LAB_01ea9adc;
          }
          uVar23 = uVar25 & 0xfffffffffffffff0;
          lVar13 = 0;
          for (uVar25 = uVar30; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
            lVar13 = lVar13 + 1;
          }
          uVar25 = *(ulong *)(uVar23 + lVar13 * 8);
          uVar24 = (uint)uVar30 - 1 & (uint)uVar30;
          uVar30 = (ulong)uVar24;
          if (uVar24 != 0) {
            uVar84 = *(uint *)(local_1120 + lVar13 * 4);
            lVar13 = 0;
            for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
              lVar13 = lVar13 + 1;
            }
            uVar24 = uVar24 - 1 & uVar24;
            uVar26 = (ulong)uVar24;
            uVar30 = *(ulong *)(uVar23 + lVar13 * 8);
            uVar22 = *(uint *)(local_1120 + lVar13 * 4);
            if (uVar24 == 0) {
              if (uVar84 < uVar22) {
                *(ulong *)*pauVar19 = uVar30;
                *(uint *)((long)*pauVar19 + 8) = uVar22;
                pauVar19 = pauVar19 + 1;
              }
              else {
                *(ulong *)*pauVar19 = uVar25;
                *(uint *)((long)*pauVar19 + 8) = uVar84;
                pauVar19 = pauVar19 + 1;
                uVar25 = uVar30;
              }
            }
            else {
              auVar35._8_8_ = 0;
              auVar35._0_8_ = uVar25;
              auVar35 = vpunpcklqdq_avx(auVar35,ZEXT416(uVar84));
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar30;
              auVar34 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar22));
              lVar13 = 0;
              for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                lVar13 = lVar13 + 1;
              }
              uVar24 = uVar24 - 1 & uVar24;
              uVar25 = (ulong)uVar24;
              auVar69._8_8_ = 0;
              auVar69._0_8_ = *(ulong *)(uVar23 + lVar13 * 8);
              auVar64 = vpunpcklqdq_avx(auVar69,ZEXT416(*(uint *)(local_1120 + lVar13 * 4)));
              auVar31 = vpshufd_avx(auVar35,0xaa);
              auVar32 = vpshufd_avx(auVar34,0xaa);
              auVar33 = vpshufd_avx(auVar64,0xaa);
              if (uVar24 == 0) {
                uVar25 = vpcmpgtd_avx512vl(auVar32,auVar31);
                uVar25 = uVar25 & 0xf;
                auVar32 = vpblendmd_avx512vl(auVar34,auVar35);
                bVar3 = (bool)((byte)uVar25 & 1);
                auVar36._0_4_ = (uint)bVar3 * auVar32._0_4_ | (uint)!bVar3 * auVar31._0_4_;
                bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
                auVar36._4_4_ = (uint)bVar3 * auVar32._4_4_ | (uint)!bVar3 * auVar31._4_4_;
                bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
                auVar36._8_4_ = (uint)bVar3 * auVar32._8_4_ | (uint)!bVar3 * auVar31._8_4_;
                bVar3 = SUB81(uVar25 >> 3,0);
                auVar36._12_4_ = (uint)bVar3 * auVar32._12_4_ | (uint)!bVar3 * auVar31._12_4_;
                auVar34 = vmovdqa32_avx512vl(auVar34);
                bVar3 = (bool)((byte)uVar25 & 1);
                auVar37._0_4_ = (uint)bVar3 * auVar34._0_4_ | (uint)!bVar3 * auVar35._0_4_;
                bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
                auVar37._4_4_ = (uint)bVar3 * auVar34._4_4_ | (uint)!bVar3 * auVar35._4_4_;
                bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
                auVar37._8_4_ = (uint)bVar3 * auVar34._8_4_ | (uint)!bVar3 * auVar35._8_4_;
                bVar3 = SUB81(uVar25 >> 3,0);
                auVar37._12_4_ = (uint)bVar3 * auVar34._12_4_ | (uint)!bVar3 * auVar35._12_4_;
                auVar35 = vpshufd_avx(auVar36,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar33,auVar35);
                uVar30 = uVar30 & 0xf;
                auVar34 = vpblendmd_avx512vl(auVar64,auVar36);
                bVar3 = (bool)((byte)uVar30 & 1);
                bVar4 = (bool)((byte)(uVar30 >> 1) & 1);
                uVar25 = CONCAT44((uint)bVar4 * auVar34._4_4_ | (uint)!bVar4 * auVar35._4_4_,
                                  (uint)bVar3 * auVar34._0_4_ | (uint)!bVar3 * auVar35._0_4_);
                auVar35 = vmovdqa32_avx512vl(auVar64);
                bVar3 = (bool)((byte)uVar30 & 1);
                auVar38._0_4_ = (uint)bVar3 * auVar35._0_4_ | !bVar3 * auVar36._0_4_;
                bVar3 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar38._4_4_ = (uint)bVar3 * auVar35._4_4_ | !bVar3 * auVar36._4_4_;
                bVar3 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar38._8_4_ = (uint)bVar3 * auVar35._8_4_ | !bVar3 * auVar36._8_4_;
                bVar3 = SUB81(uVar30 >> 3,0);
                auVar38._12_4_ = (uint)bVar3 * auVar35._12_4_ | !bVar3 * auVar36._12_4_;
                auVar35 = vpshufd_avx(auVar38,0xaa);
                auVar34 = vpshufd_avx(auVar37,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar35,auVar34);
                uVar30 = uVar30 & 0xf;
                auVar34 = vpblendmd_avx512vl(auVar38,auVar37);
                bVar3 = (bool)((byte)uVar30 & 1);
                auVar39._0_4_ = (uint)bVar3 * auVar34._0_4_ | (uint)!bVar3 * auVar35._0_4_;
                bVar3 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar39._4_4_ = (uint)bVar3 * auVar34._4_4_ | (uint)!bVar3 * auVar35._4_4_;
                bVar3 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar39._8_4_ = (uint)bVar3 * auVar34._8_4_ | (uint)!bVar3 * auVar35._8_4_;
                bVar3 = SUB81(uVar30 >> 3,0);
                auVar39._12_4_ = (uint)bVar3 * auVar34._12_4_ | (uint)!bVar3 * auVar35._12_4_;
                auVar35 = vmovdqa32_avx512vl(auVar38);
                bVar3 = (bool)((byte)uVar30 & 1);
                auVar40._0_4_ = (uint)bVar3 * auVar35._0_4_ | !bVar3 * auVar37._0_4_;
                bVar3 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar40._4_4_ = (uint)bVar3 * auVar35._4_4_ | !bVar3 * auVar37._4_4_;
                bVar3 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar40._8_4_ = (uint)bVar3 * auVar35._8_4_ | !bVar3 * auVar37._8_4_;
                bVar3 = SUB81(uVar30 >> 3,0);
                auVar40._12_4_ = (uint)bVar3 * auVar35._12_4_ | !bVar3 * auVar37._12_4_;
                *pauVar19 = auVar40;
                pauVar19[1] = auVar39;
                pauVar19 = pauVar19 + 2;
              }
              else {
                lVar13 = 0;
                for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                  lVar13 = lVar13 + 1;
                }
                uVar24 = *(uint *)(local_1120 + lVar13 * 4);
                auVar79._8_8_ = 0;
                auVar79._0_8_ = *(ulong *)(uVar23 + lVar13 * 8);
                auVar68 = vpunpcklqdq_avx(auVar79,ZEXT416(uVar24));
                uVar25 = vpcmpgtd_avx512vl(auVar32,auVar31);
                uVar25 = uVar25 & 0xf;
                auVar32 = vpblendmd_avx512vl(auVar34,auVar35);
                bVar3 = (bool)((byte)uVar25 & 1);
                auVar41._0_4_ = (uint)bVar3 * auVar32._0_4_ | (uint)!bVar3 * auVar31._0_4_;
                bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
                auVar41._4_4_ = (uint)bVar3 * auVar32._4_4_ | (uint)!bVar3 * auVar31._4_4_;
                bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
                auVar41._8_4_ = (uint)bVar3 * auVar32._8_4_ | (uint)!bVar3 * auVar31._8_4_;
                bVar3 = SUB81(uVar25 >> 3,0);
                auVar41._12_4_ = (uint)bVar3 * auVar32._12_4_ | (uint)!bVar3 * auVar31._12_4_;
                auVar34 = vmovdqa32_avx512vl(auVar34);
                bVar3 = (bool)((byte)uVar25 & 1);
                auVar42._0_4_ = (uint)bVar3 * auVar34._0_4_ | (uint)!bVar3 * auVar35._0_4_;
                bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
                auVar42._4_4_ = (uint)bVar3 * auVar34._4_4_ | (uint)!bVar3 * auVar35._4_4_;
                bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
                auVar42._8_4_ = (uint)bVar3 * auVar34._8_4_ | (uint)!bVar3 * auVar35._8_4_;
                bVar3 = SUB81(uVar25 >> 3,0);
                auVar42._12_4_ = (uint)bVar3 * auVar34._12_4_ | (uint)!bVar3 * auVar35._12_4_;
                auVar72._4_4_ = uVar24;
                auVar72._0_4_ = uVar24;
                auVar72._8_4_ = uVar24;
                auVar72._12_4_ = uVar24;
                uVar25 = vpcmpgtd_avx512vl(auVar72,auVar33);
                uVar25 = uVar25 & 0xf;
                auVar35 = vpblendmd_avx512vl(auVar68,auVar64);
                bVar3 = (bool)((byte)uVar25 & 1);
                auVar43._0_4_ = (uint)bVar3 * auVar35._0_4_ | !bVar3 * uVar24;
                bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
                auVar43._4_4_ = (uint)bVar3 * auVar35._4_4_ | !bVar3 * uVar24;
                bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
                auVar43._8_4_ = (uint)bVar3 * auVar35._8_4_ | !bVar3 * uVar24;
                bVar3 = SUB81(uVar25 >> 3,0);
                auVar43._12_4_ = (uint)bVar3 * auVar35._12_4_ | !bVar3 * uVar24;
                auVar35 = vmovdqa32_avx512vl(auVar68);
                bVar3 = (bool)((byte)uVar25 & 1);
                auVar44._0_4_ = (uint)bVar3 * auVar35._0_4_ | (uint)!bVar3 * auVar64._0_4_;
                bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
                auVar44._4_4_ = (uint)bVar3 * auVar35._4_4_ | (uint)!bVar3 * auVar64._4_4_;
                bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
                auVar44._8_4_ = (uint)bVar3 * auVar35._8_4_ | (uint)!bVar3 * auVar64._8_4_;
                bVar3 = SUB81(uVar25 >> 3,0);
                auVar44._12_4_ = (uint)bVar3 * auVar35._12_4_ | (uint)!bVar3 * auVar64._12_4_;
                auVar35 = vpshufd_avx(auVar44,0xaa);
                auVar34 = vpshufd_avx(auVar42,0xaa);
                uVar25 = vpcmpgtd_avx512vl(auVar35,auVar34);
                uVar25 = uVar25 & 0xf;
                auVar34 = vpblendmd_avx512vl(auVar44,auVar42);
                bVar3 = (bool)((byte)uVar25 & 1);
                auVar45._0_4_ = (uint)bVar3 * auVar34._0_4_ | (uint)!bVar3 * auVar35._0_4_;
                bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
                auVar45._4_4_ = (uint)bVar3 * auVar34._4_4_ | (uint)!bVar3 * auVar35._4_4_;
                bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
                auVar45._8_4_ = (uint)bVar3 * auVar34._8_4_ | (uint)!bVar3 * auVar35._8_4_;
                bVar3 = SUB81(uVar25 >> 3,0);
                auVar45._12_4_ = (uint)bVar3 * auVar34._12_4_ | (uint)!bVar3 * auVar35._12_4_;
                auVar31 = vmovdqa32_avx512vl(auVar44);
                bVar3 = (bool)((byte)uVar25 & 1);
                bVar5 = (bool)((byte)(uVar25 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                bVar8 = SUB81(uVar25 >> 3,0);
                auVar35 = vpshufd_avx(auVar43,0xaa);
                auVar34 = vpshufd_avx(auVar41,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar35,auVar34);
                uVar30 = uVar30 & 0xf;
                auVar34 = vpblendmd_avx512vl(auVar43,auVar41);
                bVar4 = (bool)((byte)uVar30 & 1);
                bVar6 = (bool)((byte)(uVar30 >> 1) & 1);
                uVar25 = CONCAT44((uint)bVar6 * auVar34._4_4_ | (uint)!bVar6 * auVar35._4_4_,
                                  (uint)bVar4 * auVar34._0_4_ | (uint)!bVar4 * auVar35._0_4_);
                auVar35 = vmovdqa32_avx512vl(auVar43);
                bVar4 = (bool)((byte)uVar30 & 1);
                auVar46._0_4_ = (uint)bVar4 * auVar35._0_4_ | !bVar4 * auVar41._0_4_;
                bVar4 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar4 * auVar35._4_4_ | !bVar4 * auVar41._4_4_;
                bVar4 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar4 * auVar35._8_4_ | !bVar4 * auVar41._8_4_;
                bVar4 = SUB81(uVar30 >> 3,0);
                auVar46._12_4_ = (uint)bVar4 * auVar35._12_4_ | !bVar4 * auVar41._12_4_;
                auVar35 = vpshufd_avx(auVar46,0xaa);
                auVar34 = vpshufd_avx(auVar45,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar34,auVar35);
                uVar30 = uVar30 & 0xf;
                auVar34 = vpblendmd_avx512vl(auVar45,auVar46);
                bVar4 = (bool)((byte)uVar30 & 1);
                auVar47._0_4_ = (uint)bVar4 * auVar34._0_4_ | (uint)!bVar4 * auVar35._0_4_;
                bVar4 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar47._4_4_ = (uint)bVar4 * auVar34._4_4_ | (uint)!bVar4 * auVar35._4_4_;
                bVar4 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar47._8_4_ = (uint)bVar4 * auVar34._8_4_ | (uint)!bVar4 * auVar35._8_4_;
                bVar4 = SUB81(uVar30 >> 3,0);
                auVar47._12_4_ = (uint)bVar4 * auVar34._12_4_ | (uint)!bVar4 * auVar35._12_4_;
                auVar35 = vmovdqa32_avx512vl(auVar45);
                bVar4 = (bool)((byte)uVar30 & 1);
                auVar48._0_4_ = (uint)bVar4 * auVar35._0_4_ | !bVar4 * auVar46._0_4_;
                bVar4 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar48._4_4_ = (uint)bVar4 * auVar35._4_4_ | !bVar4 * auVar46._4_4_;
                bVar4 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar48._8_4_ = (uint)bVar4 * auVar35._8_4_ | !bVar4 * auVar46._8_4_;
                bVar4 = SUB81(uVar30 >> 3,0);
                auVar48._12_4_ = (uint)bVar4 * auVar35._12_4_ | !bVar4 * auVar46._12_4_;
                *(uint *)*pauVar19 = (uint)bVar3 * auVar31._0_4_ | !bVar3 * auVar42._0_4_;
                *(uint *)((long)*pauVar19 + 4) =
                     (uint)bVar5 * auVar31._4_4_ | !bVar5 * auVar42._4_4_;
                *(uint *)((long)*pauVar19 + 8) =
                     (uint)bVar7 * auVar31._8_4_ | !bVar7 * auVar42._8_4_;
                *(uint *)((long)*pauVar19 + 0xc) =
                     (uint)bVar8 * auVar31._12_4_ | !bVar8 * auVar42._12_4_;
                pauVar19[1] = auVar48;
                pauVar19[2] = auVar47;
                pauVar19 = pauVar19 + 3;
              }
            }
          }
        }
        local_1288 = (ulong)((uint)uVar25 & 0xf) - 8;
        if (local_1288 != 0) {
          uVar25 = uVar25 & 0xfffffffffffffff0;
          local_1290 = 0;
          do {
            lVar20 = local_1290 * 0xe0;
            lVar13 = uVar25 + 0xd0 + lVar20;
            local_1140 = *(undefined8 *)(lVar13 + 0x10);
            uStack_1138 = *(undefined8 *)(lVar13 + 0x18);
            lVar13 = uVar25 + 0xc0 + lVar20;
            local_fc0 = *(undefined8 *)(lVar13 + 0x10);
            uStack_fb8 = *(undefined8 *)(lVar13 + 0x18);
            uStack_fb0 = local_fc0;
            uStack_fa8 = uStack_fb8;
            uStack_1130 = local_1140;
            uStack_1128 = uStack_1138;
            auVar56._16_16_ = *(undefined1 (*) [16])(uVar25 + 0x60 + lVar20);
            auVar56._0_16_ = *(undefined1 (*) [16])(uVar25 + lVar20);
            auVar57._16_16_ = *(undefined1 (*) [16])(uVar25 + 0x70 + lVar20);
            auVar57._0_16_ = *(undefined1 (*) [16])(uVar25 + 0x10 + lVar20);
            auVar80._16_16_ = *(undefined1 (*) [16])(uVar25 + 0x80 + lVar20);
            auVar80._0_16_ = *(undefined1 (*) [16])(uVar25 + 0x20 + lVar20);
            auVar35 = *(undefined1 (*) [16])(uVar25 + 0x30 + lVar20);
            auVar49._16_16_ = auVar35;
            auVar49._0_16_ = auVar35;
            auVar34 = *(undefined1 (*) [16])(uVar25 + 0x40 + lVar20);
            auVar61._16_16_ = auVar34;
            auVar61._0_16_ = auVar34;
            auVar31 = *(undefined1 (*) [16])(uVar25 + 0x50 + lVar20);
            auVar60._16_16_ = auVar31;
            auVar60._0_16_ = auVar31;
            auVar32 = *(undefined1 (*) [16])(uVar25 + 0x90 + lVar20);
            auVar76._16_16_ = auVar32;
            auVar76._0_16_ = auVar32;
            auVar32 = *(undefined1 (*) [16])(uVar25 + 0xa0 + lVar20);
            auVar59._16_16_ = auVar32;
            auVar59._0_16_ = auVar32;
            auVar32 = *(undefined1 (*) [16])(uVar25 + 0xb0 + lVar20);
            auVar82._16_16_ = auVar32;
            auVar82._0_16_ = auVar32;
            auVar49 = vsubps_avx(auVar56,auVar49);
            auVar61 = vsubps_avx(auVar57,auVar61);
            auVar60 = vsubps_avx(auVar80,auVar60);
            auVar76 = vsubps_avx(auVar76,auVar56);
            auVar59 = vsubps_avx(auVar59,auVar57);
            auVar58 = vsubps_avx(auVar82,auVar80);
            auVar50._4_4_ = auVar61._4_4_ * auVar58._4_4_;
            auVar50._0_4_ = auVar61._0_4_ * auVar58._0_4_;
            auVar50._8_4_ = auVar61._8_4_ * auVar58._8_4_;
            auVar50._12_4_ = auVar61._12_4_ * auVar58._12_4_;
            auVar50._16_4_ = auVar61._16_4_ * auVar58._16_4_;
            auVar50._20_4_ = auVar61._20_4_ * auVar58._20_4_;
            auVar50._24_4_ = auVar61._24_4_ * auVar58._24_4_;
            auVar50._28_4_ = auVar35._12_4_;
            auVar32 = vfmsub231ps_fma(auVar50,auVar59,auVar60);
            auVar51._4_4_ = auVar60._4_4_ * auVar76._4_4_;
            auVar51._0_4_ = auVar60._0_4_ * auVar76._0_4_;
            auVar51._8_4_ = auVar60._8_4_ * auVar76._8_4_;
            auVar51._12_4_ = auVar60._12_4_ * auVar76._12_4_;
            auVar51._16_4_ = auVar60._16_4_ * auVar76._16_4_;
            auVar51._20_4_ = auVar60._20_4_ * auVar76._20_4_;
            auVar51._24_4_ = auVar60._24_4_ * auVar76._24_4_;
            auVar51._28_4_ = auVar34._12_4_;
            auVar34 = vfmsub231ps_fma(auVar51,auVar58,auVar49);
            auVar55._4_4_ = auVar49._4_4_ * auVar59._4_4_;
            auVar55._0_4_ = auVar49._0_4_ * auVar59._0_4_;
            auVar55._8_4_ = auVar49._8_4_ * auVar59._8_4_;
            auVar55._12_4_ = auVar49._12_4_ * auVar59._12_4_;
            auVar55._16_4_ = auVar49._16_4_ * auVar59._16_4_;
            auVar55._20_4_ = auVar49._20_4_ * auVar59._20_4_;
            auVar55._24_4_ = auVar49._24_4_ * auVar59._24_4_;
            auVar55._28_4_ = auVar31._12_4_;
            uVar70 = *(undefined4 *)&(local_1270->super_RayK<1>).dir.field_0;
            auVar91._4_4_ = uVar70;
            auVar91._0_4_ = uVar70;
            auVar91._8_4_ = uVar70;
            auVar91._12_4_ = uVar70;
            auVar91._16_4_ = uVar70;
            auVar91._20_4_ = uVar70;
            auVar91._24_4_ = uVar70;
            auVar91._28_4_ = uVar70;
            auVar50 = vbroadcastss_avx512vl
                                (ZEXT416((uint)(local_1270->super_RayK<1>).dir.field_0.m128[1]));
            auVar51 = vbroadcastss_avx512vl
                                (ZEXT416((uint)(local_1270->super_RayK<1>).dir.field_0.m128[2]));
            uVar70 = *(undefined4 *)&(local_1270->super_RayK<1>).org.field_0;
            auVar52._4_4_ = uVar70;
            auVar52._0_4_ = uVar70;
            auVar52._8_4_ = uVar70;
            auVar52._12_4_ = uVar70;
            auVar52._16_4_ = uVar70;
            auVar52._20_4_ = uVar70;
            auVar52._24_4_ = uVar70;
            auVar52._28_4_ = uVar70;
            auVar52 = vsubps_avx512vl(auVar56,auVar52);
            auVar31 = vfmsub231ps_fma(auVar55,auVar76,auVar61);
            uVar70 = *(undefined4 *)((long)&(local_1270->super_RayK<1>).org.field_0 + 4);
            auVar53._4_4_ = uVar70;
            auVar53._0_4_ = uVar70;
            auVar53._8_4_ = uVar70;
            auVar53._12_4_ = uVar70;
            auVar53._16_4_ = uVar70;
            auVar53._20_4_ = uVar70;
            auVar53._24_4_ = uVar70;
            auVar53._28_4_ = uVar70;
            auVar53 = vsubps_avx512vl(auVar57,auVar53);
            uVar70 = *(undefined4 *)((long)&(local_1270->super_RayK<1>).org.field_0 + 8);
            auVar54._4_4_ = uVar70;
            auVar54._0_4_ = uVar70;
            auVar54._8_4_ = uVar70;
            auVar54._12_4_ = uVar70;
            auVar54._16_4_ = uVar70;
            auVar54._20_4_ = uVar70;
            auVar54._24_4_ = uVar70;
            auVar54._28_4_ = uVar70;
            auVar54 = vsubps_avx512vl(auVar80,auVar54);
            auVar55 = vmulps_avx512vl(auVar50,auVar54);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar53,auVar51);
            auVar56 = vmulps_avx512vl(auVar51,auVar52);
            auVar56 = vfmsub231ps_avx512vl(auVar56,auVar54,auVar91);
            auVar57 = vmulps_avx512vl(auVar91,auVar53);
            auVar57 = vfmsub231ps_avx512vl(auVar57,auVar52,auVar50);
            auVar51 = vmulps_avx512vl(ZEXT1632(auVar31),auVar51);
            auVar50 = vfmadd231ps_avx512vl(auVar51,ZEXT1632(auVar34),auVar50);
            local_10c0 = vfmadd231ps_avx512vl(auVar50,ZEXT1632(auVar32),auVar91);
            vandps_avx512vl(local_10c0,auVar99._0_32_);
            auVar58 = vmulps_avx512vl(auVar58,auVar57);
            auVar59 = vfmadd231ps_avx512vl(auVar58,auVar56,auVar59);
            auVar35 = vfmadd231ps_fma(auVar59,auVar55,auVar76);
            vandps_avx512vl(local_10c0,auVar100._0_32_);
            uVar24 = auVar59._0_4_;
            auVar58._0_4_ = (float)(uVar24 ^ auVar35._0_4_);
            uVar84 = auVar59._4_4_;
            auVar58._4_4_ = (float)(uVar84 ^ auVar35._4_4_);
            uVar22 = auVar59._8_4_;
            auVar58._8_4_ = (float)(uVar22 ^ auVar35._8_4_);
            uVar85 = auVar59._12_4_;
            auVar58._12_4_ = (float)(uVar85 ^ auVar35._12_4_);
            fVar86 = auVar59._16_4_;
            auVar58._16_4_ = fVar86;
            fVar87 = auVar59._20_4_;
            auVar58._20_4_ = fVar87;
            fVar88 = auVar59._24_4_;
            auVar58._24_4_ = fVar88;
            fVar89 = auVar59._28_4_;
            auVar58._28_4_ = fVar89;
            auVar60 = vmulps_avx512vl(auVar60,auVar57);
            auVar61 = vfmadd231ps_avx512vl(auVar60,auVar61,auVar56);
            auVar35 = vfmadd231ps_fma(auVar61,auVar49,auVar55);
            auVar81._0_4_ = (float)(uVar24 ^ auVar35._0_4_);
            auVar81._4_4_ = (float)(uVar84 ^ auVar35._4_4_);
            auVar81._8_4_ = (float)(uVar22 ^ auVar35._8_4_);
            auVar81._12_4_ = (float)(uVar85 ^ auVar35._12_4_);
            auVar81._16_4_ = fVar86;
            auVar81._20_4_ = fVar87;
            auVar81._24_4_ = fVar88;
            auVar81._28_4_ = fVar89;
            auVar49 = auVar101._0_32_;
            uVar9 = vcmpps_avx512vl(auVar58,auVar49,5);
            uVar10 = vcmpps_avx512vl(auVar81,auVar49,5);
            uVar11 = vcmpps_avx512vl(local_10c0,auVar49,4);
            auVar90._0_4_ = auVar58._0_4_ + auVar81._0_4_;
            auVar90._4_4_ = auVar58._4_4_ + auVar81._4_4_;
            auVar90._8_4_ = auVar58._8_4_ + auVar81._8_4_;
            auVar90._12_4_ = auVar58._12_4_ + auVar81._12_4_;
            auVar90._16_4_ = fVar86 + fVar86;
            auVar90._20_4_ = fVar87 + fVar87;
            auVar90._24_4_ = fVar88 + fVar88;
            auVar90._28_4_ = fVar89 + fVar89;
            uVar12 = vcmpps_avx512vl(auVar90,local_10c0,2);
            local_109f = (byte)uVar9 & (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
            if (local_109f != 0) {
              auVar17._4_4_ = auVar54._4_4_ * auVar31._4_4_;
              auVar17._0_4_ = auVar54._0_4_ * auVar31._0_4_;
              auVar17._8_4_ = auVar54._8_4_ * auVar31._8_4_;
              auVar17._12_4_ = auVar54._12_4_ * auVar31._12_4_;
              auVar17._16_4_ = auVar54._16_4_ * 0.0;
              auVar17._20_4_ = auVar54._20_4_ * 0.0;
              auVar17._24_4_ = auVar54._24_4_ * 0.0;
              auVar17._28_4_ = auVar54._28_4_;
              auVar35 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar34),auVar17);
              auVar35 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar32),ZEXT1632(auVar35));
              local_10e0._0_4_ = (float)(uVar24 ^ auVar35._0_4_);
              local_10e0._4_4_ = (float)(uVar84 ^ auVar35._4_4_);
              local_10e0._8_4_ = (float)(uVar22 ^ auVar35._8_4_);
              local_10e0._12_4_ = (float)(uVar85 ^ auVar35._12_4_);
              local_10e0._16_4_ = fVar86;
              local_10e0._20_4_ = fVar87;
              local_10e0._24_4_ = fVar88;
              local_10e0._28_4_ = fVar89;
              uVar70 = *(undefined4 *)((long)&(local_1270->super_RayK<1>).org.field_0 + 0xc);
              auVar14._4_4_ = uVar70;
              auVar14._0_4_ = uVar70;
              auVar14._8_4_ = uVar70;
              auVar14._12_4_ = uVar70;
              auVar14._16_4_ = uVar70;
              auVar14._20_4_ = uVar70;
              auVar14._24_4_ = uVar70;
              auVar14._28_4_ = uVar70;
              auVar49 = vmulps_avx512vl(local_10c0,auVar14);
              uVar9 = vcmpps_avx512vl(auVar49,local_10e0,1);
              fVar71 = (local_1270->super_RayK<1>).tfar;
              auVar15._4_4_ = fVar71;
              auVar15._0_4_ = fVar71;
              auVar15._8_4_ = fVar71;
              auVar15._12_4_ = fVar71;
              auVar15._16_4_ = fVar71;
              auVar15._20_4_ = fVar71;
              auVar15._24_4_ = fVar71;
              auVar15._28_4_ = fVar71;
              auVar49 = vmulps_avx512vl(local_10c0,auVar15);
              uVar10 = vcmpps_avx512vl(local_10e0,auVar49,2);
              local_109f = (byte)uVar9 & (byte)uVar10 & local_109f;
              if (local_109f != 0) {
                auVar49 = *(undefined1 (*) [32])&(local_1270->super_RayK<1>).tfar;
                auVar83 = ZEXT3264(auVar49);
                uVar24 = vextractps_avx(auVar49._0_16_,1);
                auVar49 = vsubps_avx(local_10c0,auVar81);
                local_1120 = vblendps_avx(auVar58,auVar49,0xf0);
                auVar49 = vsubps_avx(local_10c0,auVar58);
                local_1100 = vblendps_avx(auVar81,auVar49,0xf0);
                auVar49 = auVar102._0_32_;
                local_1020 = vmulps_avx512vl(ZEXT1632(auVar32),auVar49);
                local_1000 = vmulps_avx512vl(ZEXT1632(auVar34),auVar49);
                local_fe0 = vmulps_avx512vl(ZEXT1632(auVar31),auVar49);
                auVar49 = vrcp14ps_avx512vl(local_10c0);
                auVar61 = vfnmadd213ps_avx512vl(local_10c0,auVar49,auVar103._0_32_);
                auVar35 = vfmadd132ps_fma(auVar61,auVar49,auVar49);
                fVar71 = auVar35._0_4_;
                fVar73 = auVar35._4_4_;
                local_1040._4_4_ = fVar73 * local_10e0._4_4_;
                local_1040._0_4_ = fVar71 * local_10e0._0_4_;
                fVar74 = auVar35._8_4_;
                local_1040._8_4_ = fVar74 * local_10e0._8_4_;
                fVar75 = auVar35._12_4_;
                local_1040._12_4_ = fVar75 * local_10e0._12_4_;
                local_1040._16_4_ = fVar86 * 0.0;
                local_1040._20_4_ = fVar87 * 0.0;
                local_1040._24_4_ = fVar88 * 0.0;
                local_1040._28_4_ = fVar89;
                auVar67 = ZEXT3264(local_1040);
                local_1080[0] = local_1120._0_4_ * fVar71;
                local_1080[1] = local_1120._4_4_ * fVar73;
                local_1080[2] = local_1120._8_4_ * fVar74;
                local_1080[3] = local_1120._12_4_ * fVar75;
                fStack_1070 = local_1120._16_4_ * 0.0;
                fStack_106c = local_1120._20_4_ * 0.0;
                fStack_1068 = local_1120._24_4_ * 0.0;
                uStack_1064 = auVar49._28_4_;
                local_1060[0] = local_1100._0_4_ * fVar71;
                local_1060[1] = local_1100._4_4_ * fVar73;
                local_1060[2] = local_1100._8_4_ * fVar74;
                local_1060[3] = local_1100._12_4_ * fVar75;
                fStack_1050 = local_1100._16_4_ * 0.0;
                fStack_104c = local_1100._20_4_ * 0.0;
                fStack_1048 = local_1100._24_4_ * 0.0;
                uStack_1044 = auVar49._28_4_;
                auVar65._8_4_ = 0x7f800000;
                auVar65._0_8_ = 0x7f8000007f800000;
                auVar65._12_4_ = 0x7f800000;
                auVar65._16_4_ = 0x7f800000;
                auVar65._20_4_ = 0x7f800000;
                auVar65._24_4_ = 0x7f800000;
                auVar65._28_4_ = 0x7f800000;
                auVar49 = vblendmps_avx512vl(auVar65,local_1040);
                auVar62._0_4_ =
                     (uint)(local_109f & 1) * auVar49._0_4_ |
                     (uint)!(bool)(local_109f & 1) * 0x7f800000;
                bVar3 = (bool)(local_109f >> 1 & 1);
                auVar62._4_4_ = (uint)bVar3 * auVar49._4_4_ | (uint)!bVar3 * 0x7f800000;
                bVar3 = (bool)(local_109f >> 2 & 1);
                auVar62._8_4_ = (uint)bVar3 * auVar49._8_4_ | (uint)!bVar3 * 0x7f800000;
                bVar3 = (bool)(local_109f >> 3 & 1);
                auVar62._12_4_ = (uint)bVar3 * auVar49._12_4_ | (uint)!bVar3 * 0x7f800000;
                bVar3 = (bool)(local_109f >> 4 & 1);
                auVar62._16_4_ = (uint)bVar3 * auVar49._16_4_ | (uint)!bVar3 * 0x7f800000;
                bVar3 = (bool)(local_109f >> 5 & 1);
                auVar62._20_4_ = (uint)bVar3 * auVar49._20_4_ | (uint)!bVar3 * 0x7f800000;
                bVar3 = (bool)(local_109f >> 6 & 1);
                auVar62._24_4_ = (uint)bVar3 * auVar49._24_4_ | (uint)!bVar3 * 0x7f800000;
                auVar62._28_4_ =
                     (uint)(local_109f >> 7) * auVar49._28_4_ |
                     (uint)!(bool)(local_109f >> 7) * 0x7f800000;
                auVar49 = vshufps_avx(auVar62,auVar62,0xb1);
                auVar49 = vminps_avx(auVar62,auVar49);
                auVar61 = vshufpd_avx(auVar49,auVar49,5);
                auVar49 = vminps_avx(auVar49,auVar61);
                auVar61 = vpermpd_avx2(auVar49,0x4e);
                auVar49 = vminps_avx(auVar49,auVar61);
                uVar9 = vcmpps_avx512vl(auVar62,auVar49,0);
                local_12bc = (uint)local_109f;
                bVar21 = local_109f;
                if ((local_109f & (byte)uVar9) != 0) {
                  bVar21 = local_109f & (byte)uVar9;
                }
                uVar84 = 0;
                for (uVar22 = (uint)bVar21; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000) {
                  uVar84 = uVar84 + 1;
                }
                local_1258 = local_1260->scene;
                do {
                  auVar35 = auVar101._0_16_;
                  uVar22 = uVar84 & 0xff;
                  local_1208 = *(uint *)((long)&local_fc0 + (ulong)uVar22 * 4);
                  pGVar2 = (local_1258->geometries).items[local_1208].ptr;
                  if ((pGVar2->mask & uVar24) == 0) {
                    local_12bc = (uint)(~(byte)(1 << (uVar84 & 0x1f)) & (byte)local_12bc);
                  }
                  else {
                    local_1268 = local_1260->args;
                    local_1180 = auVar83._0_32_;
                    local_1160 = auVar67._0_32_;
                    local_11f0 = auVar98._0_16_;
                    local_11e0 = auVar97._0_16_;
                    local_11d0 = auVar96._0_16_;
                    local_11c0 = auVar95._0_16_;
                    local_11b0 = auVar94._0_16_;
                    local_11a0 = auVar93._0_16_;
                    local_1190 = auVar92._0_16_;
                    if (local_1260->args->filter == (RTCFilterFunctionN)0x0) {
                      local_1250.context = local_1260->user;
                      if (pGVar2->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar30 = (ulong)(uVar22 << 2);
                        fVar86 = *(float *)((long)local_1080 + uVar30);
                        fVar87 = *(float *)((long)local_1060 + uVar30);
                        (local_1270->super_RayK<1>).tfar = *(float *)(local_1040 + uVar30);
                        (local_1270->Ng).field_0.field_0.x = *(float *)(local_1020 + uVar30);
                        (local_1270->Ng).field_0.field_0.y = *(float *)(local_1000 + uVar30);
                        (local_1270->Ng).field_0.field_0.z = *(float *)(local_fe0 + uVar30);
                        local_1270->u = fVar86;
                        local_1270->v = fVar87;
                        local_1270->primID = *(uint *)((long)&local_1140 + uVar30);
                        local_1270->geomID = local_1208;
                        local_1270->instID[0] = (local_1250.context)->instID[0];
                        local_1270->instPrimID[0] = (local_1250.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_1250.context = local_1260->user;
                    }
                    uVar30 = (ulong)(uVar22 * 4);
                    local_1220 = *(float *)(local_1020 + uVar30);
                    local_121c = *(undefined4 *)(local_1000 + uVar30);
                    local_1218 = *(undefined4 *)(local_fe0 + uVar30);
                    local_1214 = *(undefined4 *)((long)local_1080 + uVar30);
                    local_1210 = *(undefined4 *)((long)local_1060 + uVar30);
                    local_120c = *(undefined4 *)((long)&local_1140 + uVar30);
                    local_1204 = (local_1250.context)->instID[0];
                    local_1200 = (local_1250.context)->instPrimID[0];
                    (local_1270->super_RayK<1>).tfar = *(float *)(local_1040 + uVar30);
                    local_1294 = -1;
                    local_1250.valid = &local_1294;
                    local_1250.geometryUserPtr = pGVar2->userPtr;
                    local_1250.ray = (RTCRayN *)local_1270;
                    local_1250.hit = (RTCHitN *)&local_1220;
                    local_1250.N = 1;
                    if (((pGVar2->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar2->intersectionFilterN)(&local_1250), *local_1250.valid != 0)) &&
                       ((local_1268->filter == (RTCFilterFunctionN)0x0 ||
                        ((((local_1268->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((pGVar2->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*local_1268->filter)(&local_1250), *local_1250.valid != 0)))))) {
                      (((Vec3f *)((long)local_1250.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1250.hit;
                      (((Vec3f *)((long)local_1250.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1250.hit + 4);
                      (((Vec3f *)((long)local_1250.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1250.hit + 8);
                      *(float *)((long)local_1250.ray + 0x3c) = *(float *)(local_1250.hit + 0xc);
                      *(float *)((long)local_1250.ray + 0x40) = *(float *)(local_1250.hit + 0x10);
                      *(float *)((long)local_1250.ray + 0x44) = *(float *)(local_1250.hit + 0x14);
                      *(float *)((long)local_1250.ray + 0x48) = *(float *)(local_1250.hit + 0x18);
                      *(float *)((long)local_1250.ray + 0x4c) = *(float *)(local_1250.hit + 0x1c);
                      *(float *)((long)local_1250.ray + 0x50) = *(float *)(local_1250.hit + 0x20);
                    }
                    else {
                      (local_1270->super_RayK<1>).tfar = (float)local_1180._0_4_;
                    }
                    auVar67 = ZEXT3264(local_1160);
                    fVar86 = (local_1270->super_RayK<1>).tfar;
                    auVar16._4_4_ = fVar86;
                    auVar16._0_4_ = fVar86;
                    auVar16._8_4_ = fVar86;
                    auVar16._12_4_ = fVar86;
                    auVar16._16_4_ = fVar86;
                    auVar16._20_4_ = fVar86;
                    auVar16._24_4_ = fVar86;
                    auVar16._28_4_ = fVar86;
                    uVar9 = vcmpps_avx512vl(local_1160,auVar16,2);
                    local_12bc = (uint)(~(byte)(1 << (uVar84 & 0x1f)) & (byte)local_12bc) &
                                 (uint)uVar9;
                    uVar24 = (local_1270->super_RayK<1>).mask;
                    auVar83 = ZEXT464((uint)(local_1270->super_RayK<1>).tfar);
                    auVar92 = ZEXT1664(local_1190);
                    auVar93 = ZEXT1664(local_11a0);
                    auVar94 = ZEXT1664(local_11b0);
                    auVar95 = ZEXT1664(local_11c0);
                    auVar96 = ZEXT1664(local_11d0);
                    auVar97 = ZEXT1664(local_11e0);
                    auVar98 = ZEXT1664(local_11f0);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar99 = ZEXT3264(auVar49);
                    auVar49 = vbroadcastsd_avx512vl(ZEXT816(0x8000000080000000));
                    auVar100 = ZEXT3264(auVar49);
                    auVar35 = vxorps_avx512vl(auVar35,auVar35);
                    auVar101 = ZEXT1664(auVar35);
                    auVar102 = ZEXT3264(_DAT_01fef940);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar103 = ZEXT3264(auVar49);
                  }
                  bVar21 = (byte)local_12bc;
                  if (bVar21 == 0) break;
                  auVar66._8_4_ = 0x7f800000;
                  auVar66._0_8_ = 0x7f8000007f800000;
                  auVar66._12_4_ = 0x7f800000;
                  auVar66._16_4_ = 0x7f800000;
                  auVar66._20_4_ = 0x7f800000;
                  auVar66._24_4_ = 0x7f800000;
                  auVar66._28_4_ = 0x7f800000;
                  auVar49 = vblendmps_avx512vl(auVar66,auVar67._0_32_);
                  auVar63._0_4_ =
                       (uint)(bVar21 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar21 & 1) * 0x7f800000;
                  bVar3 = (bool)((byte)(local_12bc >> 1) & 1);
                  auVar63._4_4_ = (uint)bVar3 * auVar49._4_4_ | (uint)!bVar3 * 0x7f800000;
                  bVar3 = (bool)((byte)(local_12bc >> 2) & 1);
                  auVar63._8_4_ = (uint)bVar3 * auVar49._8_4_ | (uint)!bVar3 * 0x7f800000;
                  bVar3 = (bool)((byte)(local_12bc >> 3) & 1);
                  auVar63._12_4_ = (uint)bVar3 * auVar49._12_4_ | (uint)!bVar3 * 0x7f800000;
                  bVar3 = (bool)((byte)(local_12bc >> 4) & 1);
                  auVar63._16_4_ = (uint)bVar3 * auVar49._16_4_ | (uint)!bVar3 * 0x7f800000;
                  bVar3 = (bool)((byte)(local_12bc >> 5) & 1);
                  auVar63._20_4_ = (uint)bVar3 * auVar49._20_4_ | (uint)!bVar3 * 0x7f800000;
                  bVar3 = (bool)((byte)(local_12bc >> 6) & 1);
                  auVar63._24_4_ = (uint)bVar3 * auVar49._24_4_ | (uint)!bVar3 * 0x7f800000;
                  auVar63._28_4_ =
                       (local_12bc >> 7) * auVar49._28_4_ |
                       (uint)!SUB41(local_12bc >> 7,0) * 0x7f800000;
                  auVar49 = vshufps_avx(auVar63,auVar63,0xb1);
                  auVar49 = vminps_avx(auVar63,auVar49);
                  auVar61 = vshufpd_avx(auVar49,auVar49,5);
                  auVar49 = vminps_avx(auVar49,auVar61);
                  auVar61 = vpermpd_avx2(auVar49,0x4e);
                  auVar49 = vminps_avx(auVar49,auVar61);
                  uVar9 = vcmpps_avx512vl(auVar63,auVar49,0);
                  bVar21 = (byte)uVar9 & bVar21;
                  uVar22 = local_12bc;
                  if (bVar21 != 0) {
                    uVar22 = (uint)bVar21;
                  }
                  uVar84 = 0;
                  for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000) {
                    uVar84 = uVar84 + 1;
                  }
                } while( true );
              }
            }
            local_1290 = local_1290 + 1;
          } while (local_1290 != local_1288);
        }
        fVar86 = (local_1270->super_RayK<1>).tfar;
        auVar67 = ZEXT1664(CONCAT412(fVar86,CONCAT48(fVar86,CONCAT44(fVar86,fVar86))));
      }
    } while (pauVar19 != (undefined1 (*) [16])&local_fa0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }